

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int DataManager::getLinkIndex(char *name,int *index,Network *nw)

{
  int iVar1;
  allocator local_49;
  string local_48 [32];
  Network *local_28;
  Network *nw_local;
  int *index_local;
  char *name_local;
  
  local_28 = nw;
  nw_local = (Network *)index;
  index_local = (int *)name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,name,&local_49);
  iVar1 = Network::indexOf(nw,LINK,(string *)local_48);
  *(int *)&(nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar1;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (*(int *)&(nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start < 0) {
    name_local._4_4_ = 0xcd;
  }
  else {
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

int DataManager::getLinkIndex(char* name, int* index, Network* nw)
{
    *index = nw->indexOf(Element::LINK, name);
    if ( *index < 0 ) return 205;
    return 0;
}